

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ImDrawCmd *pIVar4;
  ImDrawChannel *pIVar5;
  ImDrawCmd *pIVar6;
  ImDrawList *this_00;
  int *in_RSI;
  long in_RDI;
  int sz_1;
  int sz;
  ImDrawChannel *ch_1;
  int i_1;
  uint *idx_write;
  ImDrawCmd *cmd_write;
  int cmd_n;
  ImDrawChannel *ch;
  int i;
  int idx_offset;
  ImDrawCmd *last_cmd;
  int new_idx_buffer_count;
  int new_cmd_buffer_count;
  int in_stack_ffffffffffffff7c;
  ImDrawCmd *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImDrawListSplitter *in_stack_ffffffffffffff90;
  int local_4c;
  void *local_48;
  int local_34;
  int local_28;
  uint local_24;
  ImDrawCmd *local_20;
  int local_18;
  int local_14;
  
  if (1 < *(int *)(in_RDI + 4)) {
    SetCurrentChannel(in_stack_ffffffffffffff90,
                      (ImDrawList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if ((*in_RSI != 0) &&
       (pIVar4 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80),
       pIVar4->ElemCount == 0)) {
      ImVector<ImDrawCmd>::pop_back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80);
    }
    local_14 = 0;
    local_18 = 0;
    if ((*(int *)(in_RDI + 4) < 1) || (*in_RSI < 1)) {
      pIVar4 = (ImDrawCmd *)0x0;
    }
    else {
      pIVar4 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80);
    }
    if (pIVar4 == (ImDrawCmd *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = pIVar4->IdxOffset + pIVar4->ElemCount;
    }
    local_24 = uVar3;
    local_20 = pIVar4;
    for (local_28 = 1; local_28 < *(int *)(in_RDI + 4); local_28 = local_28 + 1) {
      pIVar5 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c);
      if ((0 < (pIVar5->_CmdBuffer).Size) &&
         (pIVar6 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80),
         pIVar6->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80);
      }
      if ((0 < (pIVar5->_CmdBuffer).Size) && (local_20 != (ImDrawCmd *)0x0)) {
        in_stack_ffffffffffffff80 = local_20;
        pIVar6 = ImVector<ImDrawCmd>::operator[]
                           ((ImVector<ImDrawCmd> *)local_20,in_stack_ffffffffffffff7c);
        bVar2 = CanMergeDrawCommands(in_stack_ffffffffffffff80,pIVar6);
        if (bVar2) {
          pIVar6 = ImVector<ImDrawCmd>::operator[]
                             ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c);
          local_20->ElemCount = pIVar6->ElemCount + local_20->ElemCount;
          pIVar6 = ImVector<ImDrawCmd>::operator[]
                             ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c);
          local_24 = pIVar6->ElemCount + local_24;
          ImVector<ImDrawCmd>::erase
                    ((ImVector<ImDrawCmd> *)pIVar4,
                     (ImDrawCmd *)CONCAT44(uVar3,in_stack_ffffffffffffff88));
        }
      }
      if (0 < (pIVar5->_CmdBuffer).Size) {
        local_20 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80);
      }
      local_14 = (pIVar5->_CmdBuffer).Size + local_14;
      local_18 = (pIVar5->_IdxBuffer).Size + local_18;
      for (local_34 = 0; local_34 < (pIVar5->_CmdBuffer).Size; local_34 = local_34 + 1) {
        (pIVar5->_CmdBuffer).Data[local_34].IdxOffset = local_24;
        local_24 = (pIVar5->_CmdBuffer).Data[local_34].ElemCount + local_24;
      }
    }
    ImVector<ImDrawCmd>::resize
              ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    ImVector<unsigned_int>::resize
              ((ImVector<unsigned_int> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    this_00 = (ImDrawList *)(*(long *)(in_RSI + 2) + (long)*in_RSI * 0x38 + (long)local_14 * -0x38);
    local_48 = (void *)(*(long *)(in_RSI + 6) + (long)in_RSI[4] * 4 + (long)local_18 * -4);
    for (local_4c = 1; local_4c < *(int *)(in_RDI + 4); local_4c = local_4c + 1) {
      pIVar5 = ImVector<ImDrawChannel>::operator[]
                         ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c);
      iVar1 = (pIVar5->_CmdBuffer).Size;
      if (iVar1 != 0) {
        memcpy(this_00,(pIVar5->_CmdBuffer).Data,(long)iVar1 * 0x38);
        this_00 = (ImDrawList *)((long)&this_00->CmdBuffer + (long)iVar1 * 0x38);
      }
      iVar1 = (pIVar5->_IdxBuffer).Size;
      if (iVar1 != 0) {
        memcpy(local_48,(pIVar5->_IdxBuffer).Data,(long)iVar1 << 2);
        local_48 = (void *)((long)local_48 + (long)iVar1 * 4);
      }
    }
    *(void **)(in_RSI + 0x16) = local_48;
    ImDrawList::UpdateClipRect(this_00);
    ImDrawList::UpdateTextureID(this_00);
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    if (draw_list->CmdBuffer.Size != 0 && draw_list->CmdBuffer.back().ElemCount == 0)
        draw_list->CmdBuffer.pop_back();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();
        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL && CanMergeDrawCommands(last_cmd, &ch._CmdBuffer[0]))
        {
            // Merge previous channel last draw command with current channel first draw command if matching.
            last_cmd->ElemCount += ch._CmdBuffer[0].ElemCount;
            idx_offset += ch._CmdBuffer[0].ElemCount;
            ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;
    draw_list->UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    draw_list->UpdateTextureID();
    _Count = 1;
}